

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O2

void calcBias<Blob<224>,Blob<128>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t bit;
  int *piVar3;
  uint32_t bit_00;
  uint uVar4;
  Blob<224> K;
  Blob<128> B;
  Blob<128> A;
  
  Blob<224>::Blob(&K);
  Blob<128>::Blob(&A);
  Blob<128>::Blob(&B);
  for (uVar4 = 0; uVar4 != (~(reps >> 0x1f) & reps); uVar4 = uVar4 + 1) {
    if ((verbose) && ((int)uVar4 % (reps / 10) == 0)) {
      putchar(0x2e);
    }
    Rand::rand_p(r,&K,0x1c);
    (*hash)(&K,0x1c,0,&A);
    piVar3 = (counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (bit = 0; bit != 0xe0; bit = bit + 1) {
      flipbit(&K,0x1c,bit);
      (*hash)(&K,0x1c,0,&B);
      flipbit(&K,0x1c,bit);
      for (bit_00 = 0; bit_00 != 0x80; bit_00 = bit_00 + 1) {
        uVar1 = getbit(&A,0x10,bit_00);
        uVar2 = getbit(&B,0x10,bit_00);
        *piVar3 = *piVar3 + (uVar2 ^ uVar1);
        piVar3 = piVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}